

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Pool *this;
  void *pvVar1;
  NoActionMemLogger logger;
  FixedArena arena;
  MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> local_fc78;
  char buffer [64000];
  
  local_fc78.m_arena = &arena;
  arena.m_used = false;
  arena.m_page = buffer;
  arena.m_size = 64000;
  this = &local_fc78.m_pool;
  local_fc78._vptr_MemContext = (_func_int **)&PTR__MemContext_00104d90;
  local_fc78.m_logger = &logger;
  local_fc78.m_pool.m_arena = local_fc78.m_arena;
  local_fc78.m_pool.m_logger = local_fc78.m_logger;
  memset(&local_fc78.m_pool.m_footprintLimit,0,0x232);
  local_fc78.m_pool.m_paddingByte = -0x33;
  pvVar1 = cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (this,100);
  cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::deallocate(this,pvVar1,0)
  ;
  pvVar1 = cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::callocate
                     (this,1,100);
  pvVar1 = cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::reallocate
                     (this,pvVar1,1000);
  cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::deallocate(this,pvVar1,0)
  ;
  cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::~MemContext
            (&local_fc78);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    char buffer[64000];
    cookmem::FixedArena arena (buffer, sizeof(buffer));
    cookmem::NoActionMemLogger logger;
    cookmem::MemContext<cookmem::FixedArena, cookmem::NoActionMemLogger> memCtx (arena, logger);

    // Allocate memory
    void* ptr = memCtx.allocate (100);

    // Free the memory
    memCtx.deallocate (ptr);

    // Much like calloc in c, allocate 100 bytes which is set to 0.
    ptr = memCtx.callocate (1, 100);

    // Change the size of the memory
    ptr = memCtx.reallocate (ptr, 1000);

    // Free the memory
    memCtx.deallocate (ptr);

    return 0;
}